

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

bool __thiscall CCoinsViewCache::SpendCoin(CCoinsViewCache *this,COutPoint *outpoint,Coin *moveout)

{
  CScript *pCVar1;
  byte bVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  iterator __it;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  __it = FetchCoin(this,outpoint);
  if (__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur !=
      (__node_type *)0x0) {
    uVar8 = (ulong)*(uint *)((long)__it.
                                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                   ._M_cur + 0x58);
    if (*(uint *)((long)__it.
                        super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                        ._M_cur + 0x6c) < 0x1d) {
      uVar8 = 0;
    }
    uVar7 = 0;
    if ((int)uVar8 != 0) {
      uVar7 = uVar8 + 0x1f & 0xfffffffffffffff0;
    }
    this->cachedCoinsUsage = this->cachedCoinsUsage - uVar7;
    if (moveout != (Coin *)0x0) {
      (moveout->out).nValue =
           (((Coin *)((long)__it.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x48))->out).nValue;
      pCVar1 = &(moveout->out).scriptPubKey;
      if (0x1c < (moveout->out).scriptPubKey.super_CScriptBase._size) {
        free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
      }
      pcVar4 = *(char **)((long)__it.
                                super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                ._M_cur + 0x50);
      uVar5 = *(undefined8 *)
               ((long)__it.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 0x58);
      uVar6 = *(undefined8 *)
               ((long)__it.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 100);
      *(undefined8 *)((long)&(moveout->out).scriptPubKey.super_CScriptBase._union + 0xc) =
           *(undefined8 *)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                   _M_cur + 0x5c);
      *(undefined8 *)((long)&(moveout->out).scriptPubKey.super_CScriptBase._union + 0x14) = uVar6;
      (pCVar1->super_CScriptBase)._union.indirect_contents.indirect = pcVar4;
      *(undefined8 *)((long)&(moveout->out).scriptPubKey.super_CScriptBase._union + 8) = uVar5;
      (moveout->out).scriptPubKey.super_CScriptBase._size =
           *(size_type *)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                   _M_cur + 0x6c);
      *(undefined4 *)
       ((long)__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur + 0x6c) = 0;
      *(undefined4 *)&moveout->field_0x28 =
           *(undefined4 *)
            ((long)__it.
                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                   _M_cur + 0x70);
    }
    bVar2 = *(byte *)((long)__it.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x40);
    if ((bVar2 & 2) == 0) {
      if (bVar2 == 0) {
        *(CoinsCachePair **)
         ((long)__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                _M_cur + 0x30) = (this->m_sentinel).second.m_prev;
        *(CoinsCachePair **)
         ((long)__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                _M_cur + 0x38) = &this->m_sentinel;
        (this->m_sentinel).second.m_prev =
             (CoinsCachePair *)
             ((long)__it.
                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                    _M_cur + 8);
        *(CoinsCachePair **)
         (*(long *)((long)__it.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 0x30) + 0x30) =
             (CoinsCachePair *)
             ((long)__it.
                    super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                    _M_cur + 8);
      }
      *(byte *)((long)__it.
                      super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                      ._M_cur + 0x40) = bVar2 | 1;
      Coin::Clear((Coin *)((long)__it.
                                 super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                 ._M_cur + 0x48));
    }
    else {
      std::
      _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->cacheCoins)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
              _M_cur);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
           _M_cur != (__node_type *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewCache::SpendCoin(const COutPoint &outpoint, Coin* moveout) {
    CCoinsMap::iterator it = FetchCoin(outpoint);
    if (it == cacheCoins.end()) return false;
    cachedCoinsUsage -= it->second.coin.DynamicMemoryUsage();
    TRACE5(utxocache, spent,
           outpoint.hash.data(),
           (uint32_t)outpoint.n,
           (uint32_t)it->second.coin.nHeight,
           (int64_t)it->second.coin.out.nValue,
           (bool)it->second.coin.IsCoinBase());
    if (moveout) {
        *moveout = std::move(it->second.coin);
    }
    if (it->second.IsFresh()) {
        cacheCoins.erase(it);
    } else {
        it->second.AddFlags(CCoinsCacheEntry::DIRTY, *it, m_sentinel);
        it->second.coin.Clear();
    }
    return true;
}